

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

_Bool Curl_conncache_foreach
                (Curl_easy *data,conncache *connc,void *param,
                _func_int_connectdata_ptr_void_ptr *func)

{
  void *pvVar1;
  connectdata *pcVar2;
  int iVar3;
  curl_hash_element *pcVar4;
  undefined8 *puVar5;
  bool bVar6;
  curl_hash_iterator iter;
  
  if (connc != (conncache *)0x0) {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    Curl_hash_start_iterate(&connc->hash,&iter);
    pcVar4 = Curl_hash_next_element(&iter);
    while (bVar6 = pcVar4 != (curl_hash_element *)0x0, bVar6) {
      pvVar1 = pcVar4->ptr;
      pcVar4 = Curl_hash_next_element(&iter);
      puVar5 = *(undefined8 **)((long)pvVar1 + 0x10);
      while (puVar5 != (undefined8 *)0x0) {
        pcVar2 = (connectdata *)*puVar5;
        puVar5 = (undefined8 *)puVar5[2];
        iVar3 = (*func)(pcVar2,param);
        if (iVar3 == 1) {
          if (data->share == (Curl_share *)0x0) {
            return true;
          }
          goto LAB_00138521;
        }
      }
    }
    if (data->share != (Curl_share *)0x0) {
LAB_00138521:
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool Curl_conncache_foreach(struct Curl_easy *data,
                            struct conncache *connc,
                            void *param,
                            int (*func)(struct connectdata *conn, void *param))
{
  struct curl_hash_iterator iter;
  struct curl_llist_element *curr;
  struct curl_hash_element *he;

  if(!connc)
    return FALSE;

  CONN_LOCK(data);
  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectbundle *bundle;

    bundle = he->ptr;
    he = Curl_hash_next_element(&iter);

    curr = bundle->conn_list.head;
    while(curr) {
      /* Yes, we need to update curr before calling func(), because func()
         might decide to remove the connection */
      struct connectdata *conn = curr->ptr;
      curr = curr->next;

      if(1 == func(conn, param)) {
        CONN_UNLOCK(data);
        return TRUE;
      }
    }
  }
  CONN_UNLOCK(data);
  return FALSE;
}